

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemo_common.hpp
# Opt level: O1

void cos1D_display<IMLE>(IMLE *imleObj)

{
  long *plVar1;
  ostream *poVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Input dimension: ",0x11)
  ;
  plVar1 = (long *)std::ostream::operator<<(&std::cout,imleObj->d);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Output dimension: ",0x12);
  plVar1 = (long *)std::ostream::operator<<(&std::cout,imleObj->D);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\t --- Number of experts: ---",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  plVar1 = (long *)std::ostream::operator<<(&std::cout,imleObj->M);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\t --- Common Sigma: ---",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  poVar2 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&imleObj->Sigma);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\t --- Common Psi: ---",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  poVar2 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&imleObj->Psi);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\t --- Internal Data: ---",0x18);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  poVar2 = operator<<((ostream *)&std::cout,imleObj);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void cos1D_display( Learner &imleObj)
{
    // Dimensions:
    cout << "Input dimension: "  << imleObj.inputDim() << endl;
    cout << "Output dimension: " << imleObj.outputDim() << endl;

    // Number of Experts
    cout << "\t --- Number of experts: ---" << endl;
    cout << imleObj.getNumberOfExperts() << endl;

    // Common Sigma
    cout << "\t --- Common Sigma: ---" << endl;
    cout << imleObj.getSigma() << endl;

    // Psi
    cout << "\t --- Common Psi: ---" << endl;
    cout << imleObj.getPsi() << endl;

    // Showing internal data
    cout << "\t --- Internal Data: ---" << endl;
    cout << imleObj << endl;
}